

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  unspecified_bool_type p_Var1;
  bool bVar2;
  xml_node local_68;
  char_t *local_60;
  char_t *jname;
  xml_node_struct *j;
  char_t *local_48;
  char_t *next_segment;
  char_t *path_segment_end;
  char_t *path_segment;
  xml_node context;
  char_t delimiter_local;
  char_t *path__local;
  xml_node *this_local;
  xml_node subsearch;
  
  context._root._7_1_ = delimiter;
  if (*path_ == delimiter) {
    path_segment = (char_t *)root(this);
  }
  else {
    path_segment = (char_t *)this->_root;
  }
  path_segment_end = path_;
  if (path_segment == (char_t *)0x0) {
    xml_node((xml_node *)&this_local);
  }
  else {
    for (; *path_segment_end == context._root._7_1_; path_segment_end = path_segment_end + 1) {
    }
    next_segment = path_segment_end;
    while( true ) {
      bVar2 = false;
      if (*next_segment != '\0') {
        bVar2 = *next_segment != context._root._7_1_;
      }
      if (!bVar2) break;
      next_segment = next_segment + 1;
    }
    if (path_segment_end == next_segment) {
      this_local = (xml_node *)path_segment;
    }
    else {
      for (local_48 = next_segment; *local_48 == context._root._7_1_; local_48 = local_48 + 1) {
      }
      if ((*path_segment_end == '.') && (path_segment_end + 1 == next_segment)) {
        this_local = (xml_node *)
                     first_element_by_path((xml_node *)&path_segment,local_48,context._root._7_1_);
      }
      else if ((*path_segment_end == '.') &&
              ((path_segment_end[1] == '.' && (path_segment_end + 2 == next_segment)))) {
        j = (xml_node_struct *)parent((xml_node *)&path_segment);
        this_local = (xml_node *)first_element_by_path((xml_node *)&j,local_48,context._root._7_1_);
      }
      else {
        for (jname = *(char_t **)(path_segment + 0x20); jname != (char_t *)0x0;
            jname = *(char_t **)(jname + 0x30)) {
          local_60 = *(char_t **)(jname + 8);
          if ((local_60 != (char_t *)0x0) &&
             (bVar2 = impl::anon_unknown_0::strequalrange
                                (local_60,path_segment_end,
                                 (long)next_segment - (long)path_segment_end), bVar2)) {
            xml_node(&local_68,(xml_node_struct *)jname);
            this_local = (xml_node *)first_element_by_path(&local_68,local_48,context._root._7_1_);
            p_Var1 = operator_cast_to_function_pointer((xml_node *)&this_local);
            if (p_Var1 != (unspecified_bool_type)0x0) {
              return (xml_node)(xml_node_struct *)this_local;
            }
          }
        }
        xml_node((xml_node *)&this_local);
      }
    }
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				const char_t* jname = j->name;
				if (jname && impl::strequalrange(jname, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}